

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

void __thiscall EOPlus::Context::SetState(Context *this,string *state,bool do_actions)

{
  bool bVar1;
  Runtime_Error *this_00;
  pointer ppVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined4 local_64;
  _Self local_60;
  _Self local_58;
  const_iterator it;
  undefined1 local_40 [8];
  string state_id;
  bool do_actions_local;
  string *state_local;
  Context *this_local;
  
  state_id.field_2._M_local_buf[0xf] = do_actions;
  util::lowercase((string *)local_40,state);
  std::__cxx11::string::operator=((string *)&this->state_name,(string *)local_40);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,"end");
  if ((bVar1) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"done"), bVar1)) {
    this->state = (State *)0x0;
    this->finished = true;
  }
  local_58._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State>_>_>
       ::find(&this->quest->states,(key_type *)local_40);
  local_60._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State>_>_>
       ::end(&this->quest->states);
  bVar1 = std::operator==(&local_58,&local_60);
  if (bVar1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"end");
    if ((!bVar1) &&
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"done"), !bVar1)) {
      this_00 = (Runtime_Error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_88,"Unknown quest state: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      Runtime_Error::Runtime_Error(this_00,&local_88);
      __cxa_throw(this_00,&Runtime_Error::typeinfo,Runtime_Error::~Runtime_Error);
    }
    local_64 = 1;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"end");
    this->finished = bVar1;
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State>_>
             ::operator->(&local_58);
    this->state = &ppVar2->second;
    (**this->_vptr_Context)(this,state,this->state);
    if ((state_id.field_2._M_local_buf[0xf] & 1U) != 0) {
      DoActions(this);
    }
    local_64 = 0;
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void Context::SetState(const std::string& state, bool do_actions)
	{
		std::string state_id = util::lowercase(state);

		this->state_name = state_id;

		if (state_id == "end" || state_id == "done")
		{
			this->state = 0;
			this->finished = true;
		}

		auto it = this->quest->states.find(state_id);

		if (it == this->quest->states.end())
		{
			if (state_id == "end" || state_id == "done")
				return;
			else
				throw Runtime_Error("Unknown quest state: " + state_id);
		}

		this->finished = (state_id == "end");
		this->state = &it->second;
		this->BeginState(state, *this->state);

		if (do_actions)
			this->DoActions();
	}